

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O2

void av1_merge_rd_stats(RD_STATS *rd_stats_dst,RD_STATS *rd_stats_src)

{
  long lVar1;
  
  if (((long)rd_stats_dst->rate != 0x7fffffff) && ((long)rd_stats_src->rate != 0x7fffffff)) {
    lVar1 = (long)rd_stats_src->rate + (long)rd_stats_dst->rate;
    if (0x7ffffffe < lVar1) {
      lVar1 = 0x7fffffff;
    }
    rd_stats_dst->rate = (int)lVar1;
    if (rd_stats_dst->zero_rate == 0) {
      rd_stats_dst->zero_rate = rd_stats_src->zero_rate;
    }
    rd_stats_dst->dist = rd_stats_dst->dist + rd_stats_src->dist;
    if ((rd_stats_dst->sse != 0x7fffffffffffffff) && (rd_stats_src->sse != 0x7fffffffffffffff)) {
      rd_stats_dst->sse = rd_stats_src->sse + rd_stats_dst->sse;
    }
    rd_stats_dst->skip_txfm = rd_stats_dst->skip_txfm & rd_stats_src->skip_txfm;
    return;
  }
  rd_stats_dst->rate = 0x7fffffff;
  rd_stats_dst->zero_rate = 0;
  rd_stats_dst->dist = 0x7fffffffffffffff;
  rd_stats_dst->rdcost = 0x7fffffffffffffff;
  rd_stats_dst->sse = 0x7fffffffffffffff;
  rd_stats_dst->skip_txfm = '\0';
  return;
}

Assistant:

static inline void av1_merge_rd_stats(RD_STATS *rd_stats_dst,
                                      const RD_STATS *rd_stats_src) {
  if (rd_stats_dst->rate == INT_MAX || rd_stats_src->rate == INT_MAX) {
    // If rd_stats_dst or rd_stats_src has invalid rate, we will make
    // rd_stats_dst invalid.
    av1_invalid_rd_stats(rd_stats_dst);
    return;
  }
  rd_stats_dst->rate = (int)AOMMIN(
      ((int64_t)rd_stats_dst->rate + (int64_t)rd_stats_src->rate), INT_MAX);
  if (!rd_stats_dst->zero_rate)
    rd_stats_dst->zero_rate = rd_stats_src->zero_rate;
  rd_stats_dst->dist += rd_stats_src->dist;
  if (rd_stats_dst->sse < INT64_MAX && rd_stats_src->sse < INT64_MAX) {
    rd_stats_dst->sse += rd_stats_src->sse;
  }
  rd_stats_dst->skip_txfm &= rd_stats_src->skip_txfm;
#if CONFIG_RD_DEBUG
  // This may run into problems when monochrome video is
  // encoded, as there will only be 1 plane
  for (int plane = 0; plane < MAX_MB_PLANE; ++plane) {
    rd_stats_dst->txb_coeff_cost[plane] += rd_stats_src->txb_coeff_cost[plane];
  }
#endif
}